

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  int iVar1;
  LY_ERR *pLVar2;
  undefined1 local_88 [8];
  unres_data node_match;
  int local_68;
  int has_predicate;
  int name_len;
  int mod_len;
  char *str;
  char *name;
  char *model;
  ly_ctx *ctx;
  lys_module *mod;
  int j;
  int i;
  lyd_node **ret_local;
  char *pcStack_20;
  int req_inst_local;
  char *path_local;
  lyd_node *data_local;
  
  mod._4_4_ = 0;
  model = (char *)data->schema->module->ctx;
  _j = ret;
  ret_local._4_4_ = req_inst;
  pcStack_20 = path;
  path_local = (char *)data;
  memset(local_88,0,0x18);
  *_j = (lyd_node *)0x0;
  for (; *(long *)(path_local + 0x28) != 0; path_local = *(char **)(path_local + 0x28)) {
  }
  if (*(long *)(path_local + 0x20) != 0) {
    while (*(long *)(*(long *)(path_local + 0x20) + 0x18) != 0) {
      path_local = *(char **)(path_local + 0x20);
    }
  }
  do {
    do {
      if (pcStack_20[mod._4_4_] == '\0') goto LAB_0011efb4;
      mod._0_4_ = parse_instance_identifier
                            (pcStack_20 + mod._4_4_,&name,&has_predicate,&str,&local_68,
                             (int *)&node_match.field_0x14);
      if ((int)mod < 1) {
        ly_vlog(LYE_INCHAR,LY_VLOG_LYD,path_local,(ulong)(uint)(int)pcStack_20[mod._4_4_ - (int)mod]
                ,pcStack_20 + (mod._4_4_ - (int)mod));
        goto LAB_0011f05b;
      }
      mod._4_4_ = (int)mod + mod._4_4_;
      _name_len = strndup(name,(long)has_predicate);
      if (_name_len == (char *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","resolve_instid");
        goto LAB_0011f05b;
      }
      ctx = (ly_ctx *)ly_ctx_get_module((ly_ctx *)model,_name_len,(char *)0x0);
      if (*(long *)(model + 0x6070) != 0) {
        if (ctx == (ly_ctx *)0x0) {
          ctx = (ly_ctx *)
                (**(code **)(model + 0x6070))(model,_name_len,0,0,*(undefined8 *)(model + 0x6078));
        }
        else if (-1 < (char)(ctx->dict).recs[2].field_0x10) {
          ctx = (ly_ctx *)
                (**(code **)(model + 0x6070))
                          (model,(ctx->dict).recs[0].value,(ctx->dict).recs[7].next,1,
                           *(undefined8 *)(model + 0x6078));
        }
      }
      free(_name_len);
      if ((((ctx == (ly_ctx *)0x0) || (-1 < (char)(ctx->dict).recs[2].field_0x10)) ||
          (((byte)(ctx->dict).recs[2].field_0x10 >> 6 & 1) != 0)) ||
         (iVar1 = resolve_data((lys_module *)ctx,str,local_68,(lyd_node *)path_local,
                               (unres_data *)local_88), iVar1 != 0)) goto LAB_0011efb4;
    } while (node_match._20_4_ == 0);
    mod._0_4_ = resolve_instid_predicate(pcStack_20 + mod._4_4_,(unres_data *)local_88);
    if ((int)mod < 1) {
      ly_vlog(LYE_INPRED,LY_VLOG_LYD,path_local,pcStack_20 + (mod._4_4_ - (int)mod));
      goto LAB_0011f05b;
    }
    mod._4_4_ = (int)mod + mod._4_4_;
  } while ((uint)node_match.type != 0);
LAB_0011efb4:
  if ((uint)node_match.type == 0) {
    if (ret_local._4_4_ < 0) {
      if ('\x01' < ly_log_level) {
        ly_log(LY_LLVRB,"There is no instance of \"%s\", but it is not required.",pcStack_20);
      }
      data_local._4_4_ = 0;
    }
    else {
      ly_vlog(LYE_NOREQINS,LY_VLOG_NONE,(void *)0x0,pcStack_20);
      data_local._4_4_ = 1;
    }
  }
  else if ((uint)node_match.type < 2) {
    *_j = *(lyd_node **)local_88;
    free((void *)local_88);
    data_local._4_4_ = 0;
  }
  else {
    ly_vlog(LYE_TOOMANY,LY_VLOG_LYD,path_local,pcStack_20,"data tree");
LAB_0011f05b:
    free((void *)local_88);
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j;
    const struct lys_module *mod;
    struct ly_ctx *ctx = data->schema->module->ctx;
    const char *model, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (; data->parent; data = data->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (data->prev) {
        for (; data->prev->next; data = data->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        str = strndup(model, mod_len);
        if (!str) {
            LOGMEM;
            goto error;
        }
        mod = ly_ctx_get_module(ctx, str, NULL);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }
        free(str);

        if (!mod || !mod->implemented || mod->disabled) {
            break;
        }

        if (resolve_data(mod, name, name_len, data, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            j = resolve_instid_predicate(&path[i], &node_match);
            if (j < 1) {
                LOGVAL(LYE_INPRED, LY_VLOG_LYD, data, &path[i-j]);
                goto error;
            }
            i += j;

            if (!node_match.count) {
                /* no instance exists */
                break;
            }
        }
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(LYE_NOREQINS, LY_VLOG_NONE, NULL, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}